

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimedata.cpp
# Opt level: O2

void __thiscall QMimeData::setData(QMimeData *this,QString *mimeType,QByteArray *data)

{
  QMimeDataPrivate *this_00;
  char *pcVar1;
  bool bVar2;
  long lVar3;
  long in_FS_OFFSET;
  QByteArrayView text;
  QArrayDataPointer<QVariant> local_60;
  undefined1 local_48 [32];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QMimeDataPrivate *)(this->super_QObject).d_ptr.d;
  local_48._0_8_ = 6.42285339593621e-323;
  local_48._8_8_ = "text/uri-list";
  bVar2 = ::operator==(mimeType,(QLatin1StringView *)local_48);
  if (bVar2) {
    pcVar1 = (data->d).ptr;
    lVar3 = (data->d).size;
    if (lVar3 == 0) {
      lVar3 = 0;
    }
    else {
      lVar3 = lVar3 - (ulong)(pcVar1[lVar3 + -1] == '\0');
    }
    text.m_data = pcVar1;
    text.m_size = lVar3;
    dataToUrls((QList<QVariant> *)&local_60,text);
    ::QVariant::QVariant((QVariant *)local_48,(QList<QVariant> *)&local_60);
    QMimeDataPrivate::setData(this_00,mimeType,(QVariant *)local_48);
    ::QVariant::~QVariant((QVariant *)local_48);
    QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_60);
  }
  else {
    ::QVariant::QVariant((QVariant *)local_48,data);
    QMimeDataPrivate::setData(this_00,mimeType,(QVariant *)local_48);
    ::QVariant::~QVariant((QVariant *)local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMimeData::setData(const QString &mimeType, const QByteArray &data)
{
    Q_D(QMimeData);

    if (mimeType == "text/uri-list"_L1) {
        auto ba = QByteArrayView(data);
        if (ba.endsWith('\0'))
            ba.chop(1);
        d->setData(mimeType, dataToUrls(ba));
    } else {
        d->setData(mimeType, QVariant(data));
    }
}